

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O1

int test_uri(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  FILE *__stream;
  int test_ret_2;
  undefined8 *puVar13;
  int n_base;
  uint uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  int test_ret_7;
  int test_ret_3;
  uint uVar17;
  int test_ret_1;
  int test_ret;
  int local_40;
  int local_3c;
  uint local_38;
  
  if (quiet == '\0') {
    puts("Testing uri : 13 of 18 functions ...");
  }
  local_3c = 0;
  uVar17 = 0;
  do {
    puVar13 = &DAT_00159d60;
    uVar14 = 0;
    do {
      iVar1 = xmlMemBlocks();
      if (uVar17 < 4) {
        uVar16 = (&DAT_00159d60)[uVar17];
      }
      else {
        uVar16 = 0;
      }
      if (uVar14 < 4) {
        uVar15 = *puVar13;
      }
      else {
        uVar15 = 0;
      }
      lVar12 = xmlBuildRelativeURI(uVar16,uVar15);
      if (lVar12 != 0) {
        (*_xmlFree)();
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBuildRelativeURI",(ulong)(uint)(iVar2 - iVar1));
        local_3c = local_3c + 1;
        printf(" %d",(ulong)uVar17);
        printf(" %d");
        putchar(10);
      }
      uVar14 = uVar14 + 1;
      puVar13 = puVar13 + 1;
    } while (uVar14 != 5);
    uVar17 = uVar17 + 1;
  } while (uVar17 != 5);
  function_tests = function_tests + 1;
  local_40 = 0;
  uVar17 = 0;
  do {
    puVar13 = &DAT_00159d60;
    uVar14 = 0;
    do {
      iVar1 = xmlMemBlocks();
      if (uVar17 < 4) {
        uVar16 = (&DAT_00159d60)[uVar17];
      }
      else {
        uVar16 = 0;
      }
      if (uVar14 < 4) {
        uVar15 = *puVar13;
      }
      else {
        uVar15 = 0;
      }
      xmlBuildRelativeURISafe(uVar16,uVar15,0);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBuildRelativeURISafe",(ulong)(uint)(iVar2 - iVar1));
        local_40 = local_40 + 1;
        printf(" %d",(ulong)uVar17);
        printf(" %d");
        printf(" %d");
        putchar(10);
      }
      uVar14 = uVar14 + 1;
      puVar13 = puVar13 + 1;
    } while (uVar14 != 5);
    uVar17 = uVar17 + 1;
  } while (uVar17 != 5);
  function_tests = function_tests + 1;
  iVar1 = 0;
  uVar17 = 0;
  do {
    puVar13 = &DAT_00159d60;
    uVar14 = 0;
    do {
      iVar2 = xmlMemBlocks();
      if (uVar17 < 4) {
        uVar16 = (&DAT_00159d60)[uVar17];
      }
      else {
        uVar16 = 0;
      }
      if (uVar14 < 4) {
        uVar15 = *puVar13;
      }
      else {
        uVar15 = 0;
      }
      lVar12 = xmlBuildURI(uVar16,uVar15);
      if (lVar12 != 0) {
        (*_xmlFree)();
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar2 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBuildURI",(ulong)(uint)(iVar3 - iVar2));
        iVar1 = iVar1 + 1;
        printf(" %d",(ulong)uVar17);
        printf(" %d");
        putchar(10);
      }
      uVar14 = uVar14 + 1;
      puVar13 = puVar13 + 1;
    } while (uVar14 != 5);
    uVar17 = uVar17 + 1;
  } while (uVar17 != 5);
  function_tests = function_tests + 1;
  iVar2 = 0;
  uVar17 = 0;
  do {
    puVar13 = &DAT_00159d60;
    uVar14 = 0;
    do {
      iVar3 = xmlMemBlocks();
      if (uVar17 < 4) {
        uVar16 = (&DAT_00159d60)[uVar17];
      }
      else {
        uVar16 = 0;
      }
      if (uVar14 < 4) {
        uVar15 = *puVar13;
      }
      else {
        uVar15 = 0;
      }
      xmlBuildURISafe(uVar16,uVar15,0);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar3 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBuildURISafe",(ulong)(uint)(iVar4 - iVar3));
        iVar2 = iVar2 + 1;
        printf(" %d",(ulong)uVar17);
        printf(" %d");
        printf(" %d");
        putchar(10);
      }
      uVar14 = uVar14 + 1;
      puVar13 = puVar13 + 1;
    } while (uVar14 != 5);
    uVar17 = uVar17 + 1;
  } while (uVar17 != 5);
  local_40 = local_40 + local_3c;
  function_tests = function_tests + 1;
  puVar13 = &DAT_00159d60;
  uVar17 = 0;
  iVar3 = 0;
  do {
    iVar4 = xmlMemBlocks();
    if (uVar17 < 4) {
      uVar16 = *puVar13;
    }
    else {
      uVar16 = 0;
    }
    lVar12 = xmlCanonicPath(uVar16);
    if (lVar12 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar4 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCanonicPath",(ulong)(uint)(iVar5 - iVar4));
      iVar3 = iVar3 + 1;
      printf(" %d",(ulong)uVar17);
      putchar(10);
    }
    uVar17 = uVar17 + 1;
    puVar13 = puVar13 + 1;
  } while (uVar17 != 5);
  function_tests = function_tests + 1;
  iVar4 = xmlMemBlocks();
  xmlNormalizeURIPath(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar5 = xmlMemBlocks();
  if (iVar4 != iVar5) {
    iVar6 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlNormalizeURIPath",(ulong)(uint)(iVar6 - iVar4));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  puVar13 = &DAT_00159d48;
  uVar17 = 0;
  iVar6 = 0;
  do {
    iVar7 = xmlMemBlocks();
    if (uVar17 < 3) {
      uVar16 = *puVar13;
    }
    else {
      uVar16 = 0;
    }
    xmlParseURIReference(0,uVar16);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar8 = xmlMemBlocks();
    if (iVar7 != iVar8) {
      iVar8 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlParseURIReference",(ulong)(uint)(iVar8 - iVar7));
      iVar6 = iVar6 + 1;
      printf(" %d",0);
      printf(" %d");
      putchar(10);
    }
    uVar17 = uVar17 + 1;
    puVar13 = puVar13 + 1;
  } while (uVar17 != 4);
  function_tests = function_tests + 1;
  puVar13 = &DAT_00159d80;
  local_3c = 0;
  uVar17 = 0;
  do {
    iVar7 = xmlMemBlocks();
    if (uVar17 < 7) {
      uVar16 = *puVar13;
    }
    else {
      uVar16 = 0;
    }
    xmlParseURISafe(uVar16,0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar8 = xmlMemBlocks();
    if (iVar7 != iVar8) {
      iVar8 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlParseURISafe",(ulong)(uint)(iVar8 - iVar7));
      local_3c = local_3c + 1;
      printf(" %d");
      printf(" %d");
      putchar(10);
    }
    uVar17 = uVar17 + 1;
    puVar13 = puVar13 + 1;
  } while (uVar17 != 8);
  function_tests = function_tests + 1;
  puVar13 = &DAT_00159d60;
  uVar17 = 0;
  iVar7 = 0;
  do {
    iVar8 = xmlMemBlocks();
    if (uVar17 < 4) {
      uVar16 = *puVar13;
    }
    else {
      uVar16 = 0;
    }
    lVar12 = xmlPathToURI(uVar16);
    if (lVar12 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar9 = xmlMemBlocks();
    if (iVar8 != iVar9) {
      iVar9 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlPathToURI",(ulong)(uint)(iVar9 - iVar8));
      iVar7 = iVar7 + 1;
      printf(" %d",(ulong)uVar17);
      putchar(10);
    }
    uVar17 = uVar17 + 1;
    puVar13 = puVar13 + 1;
  } while (uVar17 != 5);
  function_tests = function_tests + 1;
  iVar9 = 0;
  iVar8 = 0;
  do {
    iVar10 = xmlMemBlocks();
    if (iVar8 == 0) {
      __stream = fopen64("test.out","a+");
    }
    else {
      __stream = (FILE *)0x0;
    }
    xmlPrintURI(__stream,0);
    call_tests = call_tests + 1;
    if (__stream != (FILE *)0x0) {
      fclose(__stream);
    }
    xmlResetLastError();
    iVar11 = xmlMemBlocks();
    if (iVar10 != iVar11) {
      iVar11 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlPrintURI",(ulong)(uint)(iVar11 - iVar10));
      iVar9 = iVar9 + 1;
      printf(" %d");
      printf(" %d");
      putchar(10);
    }
    iVar8 = iVar8 + 1;
  } while (iVar8 == 1);
  function_tests = function_tests + 1;
  iVar8 = xmlMemBlocks();
  lVar12 = xmlSaveUri(0);
  if (lVar12 != 0) {
    (*_xmlFree)(lVar12);
  }
  iVar1 = local_40 + iVar1 + iVar2 + iVar3 + (uint)(iVar4 != iVar5) + iVar6 + local_3c;
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar2 = xmlMemBlocks();
  if (iVar8 != iVar2) {
    iVar3 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlSaveUri",(ulong)(uint)(iVar3 - iVar8));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  puVar13 = &DAT_00159d60;
  uVar17 = 0;
  local_3c = 0;
  do {
    iVar3 = xmlMemBlocks();
    if (uVar17 < 4) {
      uVar16 = *puVar13;
    }
    else {
      uVar16 = 0;
    }
    lVar12 = xmlURIEscape(uVar16);
    if (lVar12 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar3 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlURIEscape",(ulong)(uint)(iVar4 - iVar3));
      local_3c = local_3c + 1;
      printf(" %d",(ulong)uVar17);
      putchar(10);
    }
    uVar17 = uVar17 + 1;
    puVar13 = puVar13 + 1;
  } while (uVar17 != 5);
  function_tests = function_tests + 1;
  iVar3 = 0;
  uVar17 = 0;
  do {
    puVar13 = &DAT_00159d60;
    uVar14 = 0;
    do {
      iVar4 = xmlMemBlocks();
      if (uVar17 < 4) {
        uVar16 = (&DAT_00159d60)[uVar17];
      }
      else {
        uVar16 = 0;
      }
      if (uVar14 < 4) {
        uVar15 = *puVar13;
      }
      else {
        uVar15 = 0;
      }
      lVar12 = xmlURIEscapeStr(uVar16,uVar15);
      if (lVar12 != 0) {
        (*_xmlFree)();
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlURIEscapeStr",(ulong)(uint)(iVar5 - iVar4));
        iVar3 = iVar3 + 1;
        printf(" %d",(ulong)uVar17);
        printf(" %d");
        putchar(10);
      }
      uVar14 = uVar14 + 1;
      puVar13 = puVar13 + 1;
    } while (uVar14 != 5);
    uVar17 = uVar17 + 1;
  } while (uVar17 != 5);
  local_38 = (uint)(iVar8 != iVar2);
  function_tests = function_tests + 1;
  uVar17 = iVar1 + iVar7 + iVar9 + local_38 + local_3c + iVar3;
  if (uVar17 != 0) {
    printf("Module uri: %d errors\n",(ulong)uVar17);
  }
  return uVar17;
}

Assistant:

static int
test_uri(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing uri : 13 of 18 functions ...\n");
    test_ret += test_xmlBuildRelativeURI();
    test_ret += test_xmlBuildRelativeURISafe();
    test_ret += test_xmlBuildURI();
    test_ret += test_xmlBuildURISafe();
    test_ret += test_xmlCanonicPath();
    test_ret += test_xmlCreateURI();
    test_ret += test_xmlNormalizeURIPath();
    test_ret += test_xmlParseURI();
    test_ret += test_xmlParseURIRaw();
    test_ret += test_xmlParseURIReference();
    test_ret += test_xmlParseURISafe();
    test_ret += test_xmlPathToURI();
    test_ret += test_xmlPrintURI();
    test_ret += test_xmlSaveUri();
    test_ret += test_xmlURIEscape();
    test_ret += test_xmlURIEscapeStr();
    test_ret += test_xmlURIUnescapeString();

    if (test_ret != 0)
	printf("Module uri: %d errors\n", test_ret);
    return(test_ret);
}